

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<kj::Maybe<int>_> __thiscall capnp::Capability::Client::getFd(Client *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Disposer *node;
  long *plVar3;
  char *pcVar4;
  void *pvVar5;
  long in_RSI;
  TransformPromiseNodeBase *this_00;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise75;
  Maybe<int> fd;
  OwnPromiseNode local_88;
  char local_80;
  Own<capnp::ClientHook,_std::nullptr_t> local_78;
  long *local_68;
  char local_60 [4];
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 local_5c;
  OwnPromiseNode local_58;
  SourceLocation local_50;
  Disposer *local_38;
  Maybe<int> local_30;
  Maybe<int> local_28;
  
  (**(code **)(**(long **)(in_RSI + 8) + 0x28))(local_60);
  if (local_60[0] == '\x01') {
    local_28.ptr.isSet = (bool)local_60[0];
    local_28.ptr.field_1 = local_5c;
    local_60[0] = '\0';
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Maybe<int>>,kj::_::PromiseDisposer,kj::Maybe<int>>
              ((PromiseDisposer *)&local_50,&local_28);
    (this->hook).disposer = (Disposer *)local_50.fileName;
  }
  else {
    (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_50);
    local_80 = (char)local_50.fileName;
    if ((char)local_50.fileName == '\x01') {
      local_78.disposer = (Disposer *)local_50.function;
      local_50.function = (char *)0x0;
      (**(code **)(**(long **)(in_RSI + 8) + 0x20))(&local_78.ptr);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_88,&local_78);
      OVar2.ptr = local_88.ptr;
      pPVar1 = ((local_88.ptr)->super_PromiseArenaMember).arena;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_88.ptr - (long)pPVar1) < 0x28) {
        pvVar5 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_88,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_003871f0;
        *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
      }
      else {
        ((local_88.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
        this_00 = (TransformPromiseNodeBase *)&local_88.ptr[-3].super_PromiseArenaMember.arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_88,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:76:48)>
                   ::anon_class_1_0_00000001_for_func::operator());
        OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_003871f0;
        OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
      }
      local_50.fileName =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
      ;
      local_50.function = "then";
      local_50.lineNumber = 0x58b;
      local_50.columnNumber = 0x4c;
      local_58.ptr = &this_00->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_38,&local_58,&local_50);
      OVar2.ptr = local_58.ptr;
      (this->hook).disposer = local_38;
      if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
        local_58.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      OVar2.ptr = local_88.ptr;
      if (&(local_88.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_88.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      plVar3 = local_68;
      if (local_68 != (long *)0x0) {
        local_68 = (long *)0x0;
        (**(local_78.ptr)->_vptr_ClientHook)(local_78.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10))
        ;
      }
    }
    else {
      local_30.ptr.isSet = false;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<int>>,kj::_::PromiseDisposer,kj::Maybe<int>>
                ((PromiseDisposer *)&local_50,&local_30);
      pcVar4 = local_50.fileName;
      local_50.fileName = (char *)0x0;
      (this->hook).disposer = (Disposer *)pcVar4;
    }
    node = local_78.disposer;
    if ((local_80 == '\x01') &&
       ((PromiseArenaMember *)local_78.disposer != (PromiseArenaMember *)0x0)) {
      local_78.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<int>> Capability::Client::getFd() {
  auto fd = hook->getFd();
  if (fd != kj::none) {
    return fd;
  } else KJ_IF_SOME(promise, hook->whenMoreResolved()) {
    return promise.attach(hook->addRef()).then([](kj::Own<ClientHook> newHook) {
      return Client(kj::mv(newHook)).getFd();
    });
  } else {
    return kj::Maybe<int>(kj::none);
  }